

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b_tree_node.cpp
# Opt level: O0

void __thiscall b_tree_node::_remove(b_tree_node *this,int64_t k)

{
  pager *p;
  int iVar1;
  int iVar2;
  bool bVar3;
  uint16_t uVar4;
  int64_t ofs;
  undefined1 local_88 [8];
  b_tree_node child;
  int i;
  int64_t k_local;
  b_tree_node *this_local;
  
  child._child_ofs_field._4_4_ = 0;
  while( true ) {
    iVar1 = child._child_ofs_field._4_4_;
    uVar4 = _num_keys(this);
    iVar2 = child._child_ofs_field._4_4_;
    bVar3 = false;
    if (iVar1 < (int)(uint)uVar4) {
      bVar3 = this->_keys_field[child._child_ofs_field._4_4_] < k;
    }
    if (!bVar3) break;
    child._child_ofs_field._4_4_ = child._child_ofs_field._4_4_ + 1;
  }
  uVar4 = _num_keys(this);
  if ((iVar2 < (int)(uint)uVar4) && (this->_keys_field[child._child_ofs_field._4_4_] == k)) {
    this->_valid_keys_field[child._child_ofs_field._4_4_] = '\0';
  }
  else {
    bVar3 = _leaf(this);
    if (!bVar3) {
      p = this->_p;
      ofs = _child_ofs(this,child._child_ofs_field._4_2_);
      b_tree_node((b_tree_node *)local_88,p,ofs);
      _remove((b_tree_node *)local_88,k);
      ~b_tree_node((b_tree_node *)local_88);
    }
  }
  return;
}

Assistant:

void b_tree_node::_remove(int64_t k)
{
    int i = 0;
    while(i < _num_keys() && _keys_field[i] < k)
        i++;

    if(i < _num_keys() && _keys_field[i] == k)
    {
        _valid_keys_field[i] = 0;
        return;
    }

   if(_leaf())
        return;

    b_tree_node child(_p, _child_ofs(i));
    child._remove(k);
}